

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void mi_heap_free(mi_heap_t *heap)

{
  _Bool _Var1;
  mi_heap_t *in_RDI;
  void *unaff_retaddr;
  mi_heap_t *curr;
  mi_heap_t *prev;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  mi_heap_t *local_18;
  mi_heap_t *local_10;
  
  if (((in_RDI != (mi_heap_t *)0x0) && (_Var1 = mi_heap_is_initialized(in_RDI), _Var1)) &&
     (_Var1 = mi_heap_is_backing(in_RDI), !_Var1)) {
    _Var1 = mi_heap_is_default((mi_heap_t *)
                               CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    if (_Var1) {
      _mi_heap_set_default_direct((mi_heap_t *)0xc5026a);
    }
    local_10 = (mi_heap_t *)0x0;
    for (local_18 = in_RDI->tld->heaps; local_18 != in_RDI && local_18 != (mi_heap_t *)0x0;
        local_18 = local_18->next) {
      local_10 = local_18;
    }
    if (local_18 == in_RDI) {
      if (local_10 == (mi_heap_t *)0x0) {
        in_RDI->tld->heaps = in_RDI->next;
      }
      else {
        local_10->next = in_RDI->next;
      }
    }
    mi_free(unaff_retaddr);
  }
  return;
}

Assistant:

static void mi_heap_free(mi_heap_t* heap) {
  mi_assert(heap != NULL);
  mi_assert_internal(mi_heap_is_initialized(heap));
  if (heap==NULL || !mi_heap_is_initialized(heap)) return;
  if (mi_heap_is_backing(heap)) return; // dont free the backing heap

  // reset default
  if (mi_heap_is_default(heap)) {
    _mi_heap_set_default_direct(heap->tld->heap_backing);
  }

  // remove ourselves from the thread local heaps list
  // linear search but we expect the number of heaps to be relatively small
  mi_heap_t* prev = NULL;
  mi_heap_t* curr = heap->tld->heaps;
  while (curr != heap && curr != NULL) {
    prev = curr;
    curr = curr->next;
  }
  mi_assert_internal(curr == heap);
  if (curr == heap) {
    if (prev != NULL) { prev->next = heap->next; }
                 else { heap->tld->heaps = heap->next; }
  }
  mi_assert_internal(heap->tld->heaps != NULL);

  // and free the used memory
  mi_free(heap);
}